

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag.hpp
# Opt level: O0

void __thiscall
cfgfile::tag_t<cfgfile::string_trait_t>::tag_t
          (tag_t<cfgfile::string_trait_t> *this,tag_t<cfgfile::string_trait_t> *owner,string_t *name
          ,bool is_mandatory)

{
  byte in_CL;
  string *in_RDX;
  undefined8 *in_RDI;
  tag_t<cfgfile::string_trait_t> *in_stack_000001a8;
  tag_t<cfgfile::string_trait_t> *in_stack_000001b0;
  
  *in_RDI = &PTR__tag_t_00179650;
  std::__cxx11::string::string((string *)(in_RDI + 1),in_RDX);
  *(byte *)(in_RDI + 5) = in_CL & 1;
  *(undefined1 *)((long)in_RDI + 0x29) = 0;
  std::
  vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
  ::vector((vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
            *)0x13a911);
  in_RDI[9] = 0;
  in_RDI[10] = 0xffffffffffffffff;
  in_RDI[0xb] = 0xffffffffffffffff;
  add_child(in_stack_000001b0,in_stack_000001a8);
  return;
}

Assistant:

tag_t( tag_t< Trait > & owner, const typename Trait::string_t & name,
		bool is_mandatory = false )
		:   m_name( name )
		,   m_is_mandatory( is_mandatory )
		,   m_is_defined( false )
		,	m_parent( nullptr )
		,	m_line_number( -1 )
		,	m_column_number( -1 )
	{
		owner.add_child( *this );
	}